

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O1

GMM_PAGETABLEPool * __thiscall
GmmLib::GmmPageTableMgr::__GetFreePoolNode
          (GmmPageTableMgr *this,uint32_t *FreePoolNodeIdx,POOL_TYPE PoolType)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  GmmPageTablePool *pGVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&this->PoolLock);
  }
  pGVar5 = this->pPool;
  if (PoolType != POOL_TYPE_TRTTL2) {
    if (pGVar5 == (GMM_PAGETABLEPool *)0x0) {
      pGVar5 = (GMM_PAGETABLEPool *)0x0;
    }
    else {
      pGVar5 = pGVar5->NextPool;
    }
  }
  uVar9 = 0x20;
  if ((POOL_TYPE_TRTTL2 < PoolType) && (uVar9 = 0x100, PoolType != POOL_TYPE_AUXTTL2)) {
    iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    uVar9 = 0x40;
    if ((CONCAT44(extraout_var,iVar2) != 0) &&
       (iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])(),
       (*(byte *)(CONCAT44(extraout_var_00,iVar2) + 0x45) & 0x80) == 0)) {
      iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
      uVar9 = (uint)((*(byte *)(CONCAT44(extraout_var_01,iVar2) + 0x45) & 0x40) >> 6) * 0x20 + 0x20;
    }
  }
  iVar2 = 1;
  if ((POOL_TYPE_TRTTL2 < PoolType) && (iVar2 = 8, PoolType != POOL_TYPE_AUXTTL2)) {
    iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    iVar2 = 2;
    if (CONCAT44(extraout_var_02,iVar3) != 0) {
      iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
      iVar2 = 2;
      if ((*(byte *)(CONCAT44(extraout_var_03,iVar3) + 0x45) & 0x80) == 0) {
        iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
        iVar2 = 2 - (uint)((*(byte *)(CONCAT44(extraout_var_04,iVar2) + 0x45) & 0x40) == 0);
      }
    }
  }
  if ((pGVar5 == (GMM_PAGETABLEPool *)0x0) ||
     (uVar6 = (uint)(PoolType != POOL_TYPE_TRTTL2),
     this->NumNodePoolElements <= (uint)(PoolType != POOL_TYPE_TRTTL2))) {
LAB_001c382d:
    pGVar5 = __AllocateNodePool(this,iVar2 << 0xc,PoolType);
    if (pGVar5 != (GMM_PAGETABLEPool *)0x0) {
      *FreePoolNodeIdx = 0;
      goto LAB_001c384f;
    }
  }
  else {
    bVar1 = false;
    lVar8 = 0;
    do {
      if ((0 < pGVar5->NumFreeNodes) && (pGVar5->PoolType == PoolType)) {
        *FreePoolNodeIdx = 0;
        bVar1 = true;
        uVar4 = (uint)(0x200 / (ulong)uVar9);
        if ((uint)lVar8 < uVar4) {
          lVar8 = (long)(int)(uint)lVar8;
          do {
            uVar7 = ~pGVar5->NodeUsage[lVar8];
            iVar3 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
              }
            }
            if (pGVar5->NodeUsage[lVar8] != 0xffffffff) {
              *FreePoolNodeIdx = *FreePoolNodeIdx + iVar3 * iVar2;
              goto LAB_001c3813;
            }
            *FreePoolNodeIdx = *FreePoolNodeIdx + uVar9;
            lVar8 = lVar8 + 1;
          } while ((uint)lVar8 < uVar4);
          bVar1 = false;
        }
      }
LAB_001c3813:
      if (bVar1) goto LAB_001c384f;
      pGVar5 = pGVar5->NextPool;
    } while ((pGVar5 != (GmmPageTablePool *)0x0) &&
            (uVar6 = uVar6 + 1, uVar6 < this->NumNodePoolElements));
    if (!bVar1) goto LAB_001c382d;
  }
  pGVar5 = (GMM_PAGETABLEPool *)0x0;
LAB_001c384f:
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->PoolLock);
  }
  return pGVar5;
}

Assistant:

GmmLib::GMM_PAGETABLEPool *GmmLib::GmmPageTableMgr::__GetFreePoolNode(uint32_t *FreePoolNodeIdx, POOL_TYPE PoolType)
{
    uint32_t PoolNode = -1, i = 0, j = 0, DWdivisor = 1, IdxMultiplier = 1;
    bool     PoolNodeFound = false, TRTTPool = false;

    ENTER_CRITICAL_SECTION
    GmmLib::GMM_PAGETABLEPool *Pool = pPool;

    Pool = (PoolType == POOL_TYPE_TRTTL2) ? Pool : //1st pool reserved for TRTT-L2, since TRTT-L2 pruning not supported yet,
           (Pool ? Pool->GetNextPool() : NULL);    //other pools can be TR-L1/Aux-L1/Aux-L2 (and support dynamic pruning)
    TRTTPool      = (PoolType == POOL_TYPE_TRTTL2 || PoolType == POOL_TYPE_TRTTL1) ? true : false;
    DWdivisor     = TRTTPool ? 8 * sizeof(uint32_t) : (PoolType == POOL_TYPE_AUXTTL2) ? 8 * sizeof(uint32_t) * AUX_L2TABLE_SIZE_IN_POOLNODES : 8 * sizeof(uint32_t) * AUX_L1TABLE_SIZE_IN_POOLNODES_2(GetLibContext());
    IdxMultiplier = TRTTPool ? 1 : (PoolType == POOL_TYPE_AUXTTL2) ? AUX_L2TABLE_SIZE_IN_POOLNODES : AUX_L1TABLE_SIZE_IN_POOLNODES_2(GetLibContext());
    //Scan existing PageTablePools for free pool node
    for(i = (PoolType == POOL_TYPE_TRTTL2) ? 0 : 1; Pool && i < NumNodePoolElements; i++)
    {
        if(Pool->GetNumFreeNode() > 0 && Pool->GetPoolType() == PoolType)
        {
            PoolNodeFound    = true;
            *FreePoolNodeIdx = 0;
            for(; j < PAGETABLE_POOL_MAX_NODES / DWdivisor; j++)
            {
                if(_BitScanForward((uint32_t *)&PoolNode, (uint32_t) ~(Pool->GetNodeUsageAtIndex(j)))) // Get LSB that has value 0
                {
                    *FreePoolNodeIdx += PoolNode * IdxMultiplier;
                    PoolNodeFound = true;
                    break;
                }
                PoolNodeFound = false;
                *FreePoolNodeIdx += DWdivisor; //DWORD size in bits
            }
        }
        if(PoolNodeFound)
        {
            __GMM_ASSERT(Pool->GetPoolType() == PoolType);
            EXIT_CRITICAL_SECTION
            return Pool;
        }
        Pool = Pool->GetNextPool();
    }

    //No free pool node, allocate new
    if(!PoolNodeFound)
    {
        GMM_PAGETABLEPool *Pool = NULL;
        if(Pool = __AllocateNodePool(IdxMultiplier * PAGE_SIZE, PoolType))
        {
            __GMM_ASSERT(Pool->GetPoolType() == PoolType);

            *FreePoolNodeIdx = 0;
            EXIT_CRITICAL_SECTION
            return Pool;
        }
    }

    EXIT_CRITICAL_SECTION
    return NULL;
}